

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.cpp
# Opt level: O3

int main(void)

{
  long *plVar1;
  ostream *poVar2;
  long lVar3;
  clock_t end;
  thread threads [100];
  long *local_370;
  long local_368;
  clock_t local_360;
  long local_358 [101];
  
  lVar3 = 0;
  memset(local_358,0,800);
  clock();
  local_360 = clock();
  do {
    local_368 = 0;
    local_370 = (long *)operator_new(0x10);
    *local_370 = (long)&PTR___State_00104d68;
    local_370[1] = (long)&local_360;
    std::thread::_M_start_thread(&local_368,&local_370,0);
    if (local_370 != (long *)0x0) {
      (**(code **)(*local_370 + 8))();
    }
    if (local_358[lVar3] != 0) goto LAB_00102452;
    local_358[lVar3] = local_368;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  lVar3 = 0;
  do {
    std::thread::join();
    lVar3 = lVar3 + 8;
  } while (lVar3 != 800);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Result = ",9);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,count);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Time usage = ",0xd);
  poVar2 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"ms\n",3);
  getchar();
  lVar3 = 800;
  while (*(long *)((long)local_358 + lVar3 + -8) == 0) {
    lVar3 = lVar3 + -8;
    if (lVar3 == 0) {
      return 0;
    }
  }
LAB_00102452:
  std::terminate();
}

Assistant:

int main() {
	std::thread threads[MAX_THREADS]; 
    clock_t start = clock();
    clock_t end = clock(); 

    for(int i = 0;i < MAX_THREADS; i++)
    {
	    threads[i] = std::thread([&](){
			    
			    while(count <= 1000000)
			    {

			    g_mutex.lock(); 
			    count ++; 
			    if (count > MAX_LOOPS)
			    {
			    end = clock(); 
			    }
			    g_mutex.unlock(); 
			    }
			    
			    }); 

    }

    for(int i = 0;i < MAX_THREADS; i++)
    {
	    threads[i].join(); 
    }
    
    std::cout << "Result = " << count << endl;
    std::cout << "Time usage = " << end - start << "ms\n";
//system("pause");
    getchar(); 
    return 0;
}